

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_buffer.h
# Opt level: O2

void __thiscall
PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
          (ImageTemplate<unsigned_char> *this,ImageTemplate<unsigned_char> *image)

{
  this->_vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_001b3948;
  this->_width = 0;
  this->_height = 0;
  this->_colorCount = '\x01';
  this->_alignment = '\x01';
  this->_rowSize = 0;
  this->_data = (uchar *)0x0;
  this->_type = '\0';
  swap(this,image);
  return;
}

Assistant:

ImageTemplate( ImageTemplate && image )
            : _width     ( 0 )
            , _height    ( 0 )
            , _colorCount( 1 )
            , _alignment ( 1 )
            , _rowSize   ( 0 )
            , _data      ( nullptr )
            , _type      ( 0 )
        {
            swap( image );
        }